

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void InverseMoveToFrontTransform(uint8_t *v,uint32_t v_len,BrotliDecoderStateInternal *state)

{
  uint8_t *__src;
  byte bVar1;
  uint8_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint32_t uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  
  uVar10 = state->mtf_upper_bound;
  state->mtf[1] = 0x3020100;
  auVar5 = _DAT_0010a0d0;
  auVar4 = _DAT_0010a0c0;
  auVar3 = _DAT_0010a0b0;
  uVar6 = uVar10 + 1;
  uVar7 = 2;
  if (2 < uVar6) {
    uVar7 = (ulong)uVar6;
  }
  lVar8 = uVar7 - 2;
  auVar11._8_4_ = (int)lVar8;
  auVar11._0_8_ = lVar8;
  auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
  iVar13 = 0x3020100;
  iVar14 = 0x7060504;
  iVar15 = 0xb0a0908;
  iVar16 = 0xf0e0d0c;
  uVar9 = 0;
  auVar11 = auVar11 ^ _DAT_0010a0d0;
  do {
    auVar18._8_4_ = (int)uVar9;
    auVar18._0_8_ = uVar9;
    auVar18._12_4_ = (int)(uVar9 >> 0x20);
    auVar17 = (auVar18 | auVar4) ^ auVar5;
    iVar12 = auVar11._4_4_;
    if ((bool)(~(auVar17._4_4_ == iVar12 && auVar11._0_4_ < auVar17._0_4_ || iVar12 < auVar17._4_4_)
              & 1)) {
      state->mtf[uVar9 + 2] = iVar13 + 0x4040404;
    }
    if ((auVar17._12_4_ != auVar11._12_4_ || auVar17._8_4_ <= auVar11._8_4_) &&
        auVar17._12_4_ <= auVar11._12_4_) {
      state->mtf[uVar9 + 3] = iVar14 + 0x4040404;
    }
    auVar17 = (auVar18 | auVar3) ^ auVar5;
    iVar19 = auVar17._4_4_;
    if (iVar19 <= iVar12 && (iVar19 != iVar12 || auVar17._0_4_ <= auVar11._0_4_)) {
      state->mtf[uVar9 + 4] = iVar15 + 0x4040404;
      state->mtf[uVar9 + 5] = iVar16 + 0x4040404;
    }
    uVar9 = uVar9 + 4;
    iVar13 = iVar13 + 0x10101010;
    iVar14 = iVar14 + 0x10101010;
    iVar15 = iVar15 + 0x10101010;
    iVar16 = iVar16 + 0x10101010;
  } while ((uVar7 + 2 & 0xfffffffffffffffc) != uVar9);
  if (v_len == 0) {
    uVar10 = 0;
  }
  else {
    __src = (uint8_t *)((long)state->mtf + 3);
    uVar7 = 0;
    uVar6 = 0;
    do {
      bVar1 = v[uVar7];
      uVar2 = *(uint8_t *)((long)(state->mtf + 1) + (ulong)bVar1);
      v[uVar7] = uVar2;
      *__src = uVar2;
      memmove(state->mtf + 1,__src,(ulong)bVar1 + 1);
      uVar6 = uVar6 | bVar1;
      uVar7 = uVar7 + 1;
    } while (v_len != uVar7);
    uVar10 = uVar6 >> 2;
  }
  state->mtf_upper_bound = uVar10;
  return;
}

Assistant:

static BROTLI_NOINLINE void InverseMoveToFrontTransform(
    uint8_t* v, uint32_t v_len, BrotliDecoderState* state) {
  /* Reinitialize elements that could have been changed. */
  uint32_t i = 1;
  uint32_t upper_bound = state->mtf_upper_bound;
  uint32_t* mtf = &state->mtf[1];  /* Make mtf[-1] addressable. */
  uint8_t* mtf_u8 = (uint8_t*)mtf;
  /* Load endian-aware constant. */
  const uint8_t b0123[4] = {0, 1, 2, 3};
  uint32_t pattern;
  memcpy(&pattern, &b0123, 4);

  /* Initialize list using 4 consequent values pattern. */
  mtf[0] = pattern;
  do {
    pattern += 0x04040404;  /* Advance all 4 values by 4. */
    mtf[i] = pattern;
    i++;
  } while (i <= upper_bound);

  /* Transform the input. */
  upper_bound = 0;
  for (i = 0; i < v_len; ++i) {
    int index = v[i];
    uint8_t value = mtf_u8[index];
    upper_bound |= v[i];
    v[i] = value;
    mtf_u8[-1] = value;
    do {
      index--;
      mtf_u8[index + 1] = mtf_u8[index];
    } while (index >= 0);
  }
  /* Remember amount of elements to be reinitialized. */
  state->mtf_upper_bound = upper_bound >> 2;
}